

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::reportRebuild(HEkkPrimal *this,HighsInt reason_for_rebuild)

{
  string local_38;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x25,0);
  iterationAnalysisData(this);
  this->analysis->rebuild_reason = reason_for_rebuild;
  HEkk::rebuildReason_abi_cxx11_(&local_38,this->ekk_instance_,reason_for_rebuild);
  std::__cxx11::string::operator=
            ((string *)&this->analysis->rebuild_reason_string,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((this->ekk_instance_->options_->super_HighsOptionsStruct).output_flag == true) {
    HighsSimplexAnalysis::invertReport(this->analysis);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x25,0);
  return;
}

Assistant:

void HEkkPrimal::reportRebuild(const HighsInt reason_for_rebuild) {
  analysis->simplexTimerStart(ReportRebuildClock);
  iterationAnalysisData();
  analysis->rebuild_reason = reason_for_rebuild;
  analysis->rebuild_reason_string =
      ekk_instance_.rebuildReason(reason_for_rebuild);
  if (ekk_instance_.options_->output_flag) analysis->invertReport();
  analysis->simplexTimerStop(ReportRebuildClock);
}